

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O0

void __thiscall Ext_IndexNode<int>::Ext_IndexNode(Ext_IndexNode<int> *this,int N)

{
  int iVar1;
  size_type sVar2;
  allocator<Addr> local_81;
  vector<Addr,_std::allocator<Addr>_> local_80;
  allocator_type local_61;
  vector<char,_std::allocator<char>_> local_60;
  allocator<int> local_31;
  vector<int,_std::allocator<int>_> local_30;
  int local_14;
  Ext_IndexNode<int> *pEStack_10;
  int N_local;
  Ext_IndexNode<int> *this_local;
  
  local_14 = N;
  pEStack_10 = this;
  std::vector<int,_std::allocator<int>_>::vector(&this->k);
  std::vector<char,_std::allocator<char>_>::vector(&this->v);
  std::vector<Addr,_std::allocator<Addr>_>::vector(&this->p);
  sVar2 = (size_type)local_14;
  std::allocator<int>::allocator(&local_31);
  std::vector<int,_std::allocator<int>_>::vector(&local_30,sVar2,&local_31);
  std::vector<int,_std::allocator<int>_>::operator=(&this->k,&local_30);
  std::vector<int,_std::allocator<int>_>::~vector(&local_30);
  std::allocator<int>::~allocator(&local_31);
  sVar2 = (size_type)local_14;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector(&local_60,sVar2,&local_61);
  std::vector<char,_std::allocator<char>_>::operator=(&this->v,&local_60);
  std::vector<char,_std::allocator<char>_>::~vector(&local_60);
  std::allocator<char>::~allocator(&local_61);
  iVar1 = local_14 + 1;
  std::allocator<Addr>::allocator(&local_81);
  std::vector<Addr,_std::allocator<Addr>_>::vector(&local_80,(long)iVar1,&local_81);
  std::vector<Addr,_std::allocator<Addr>_>::operator=(&this->p,&local_80);
  std::vector<Addr,_std::allocator<Addr>_>::~vector(&local_80);
  std::allocator<Addr>::~allocator(&local_81);
  return;
}

Assistant:

Ext_IndexNode(int N) {
		k = vector<K>(N);
		v = vector<char>(N);
		p = vector<Addr>(N + 1);
	}